

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

void __thiscall despot::POMDPX::POMDPX(POMDPX *this,string *params_file)

{
  ValuedAction *this_00;
  double *pdVar1;
  pointer pNVar2;
  int iVar3;
  Parser *this_01;
  log_ostream *plVar4;
  ostream *poVar5;
  int s;
  long lVar6;
  int a;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  ValuedAction VVar11;
  double local_68;
  ValuedAction local_60;
  string local_50;
  
  (this->super_MDP)._vptr_MDP = (_func_int **)&PTR__MDP_0019b2a8;
  (this->super_MDP).policy_.
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MDP).policy_.
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MDP).policy_.
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MDP).blind_alpha_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MDP).blind_alpha_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MDP).blind_alpha_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DSPOMDP::DSPOMDP(&this->super_DSPOMDP);
  (this->super_MDP)._vptr_MDP = (_func_int **)&PTR__POMDPX_0019bb58;
  (this->super_DSPOMDP)._vptr_DSPOMDP = (_func_int **)&PTR__POMDPX_0019bc58;
  (this->super_StateIndexer)._vptr_StateIndexer = (_func_int **)&PTR__POMDPX_0019bd38;
  (this->super_StatePolicy)._vptr_StatePolicy = (_func_int **)&PTR__POMDPX_0019bd70;
  this_00 = &this->min_reward_action_;
  ValuedAction::ValuedAction(this_00);
  ValuedAction::ValuedAction(&this->max_reward_action_);
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rewards_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewards_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewards_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->memory_pool_).freelist_.
           super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->memory_pool_).freelist_.
           super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = 0;
  current_ = this;
  this_01 = (Parser *)operator_new(0x228);
  std::__cxx11::string::string((string *)&local_50,(string *)params_file);
  Parser::Parser(this_01,&local_50);
  this->parser_ = this_01;
  std::__cxx11::string::~string((string *)&local_50);
  VVar11 = Parser::ComputeMaxRewardAction(this->parser_);
  (this->max_reward_action_).action = VVar11.action;
  (this->max_reward_action_).value = VVar11.value;
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      poVar5 = std::operator<<(&plVar4->super_ostream,"Max reward action = ");
      poVar5 = despot::operator<<(poVar5,&this->max_reward_action_);
      std::operator<<(poVar5," ");
    }
  }
  VVar11 = Parser::ComputeMinRewardAction(this->parser_);
  (this->min_reward_action_).action = VVar11.action;
  (this->min_reward_action_).value = VVar11.value;
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      poVar5 = std::operator<<(&plVar4->super_ostream,"Min reward action = ");
      poVar5 = despot::operator<<(poVar5,this_00);
      std::operator<<(poVar5," ");
    }
  }
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      poVar5 = std::operator<<(&plVar4->super_ostream,"#State / log2(#State) = ");
      iVar3 = Parser::NumStates(this->parser_);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::operator<<(poVar5," / ");
      dVar9 = Parser::LogNumStates(this->parser_);
      poVar5 = std::ostream::_M_insert<double>(dVar9);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      poVar5 = std::operator<<(&plVar4->super_ostream,"#InitState / log2(#InitState) = ");
      iVar3 = Parser::NumInitialStates(this->parser_);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::operator<<(poVar5," / ");
      dVar9 = Parser::LogNumInitialStates(this->parser_);
      poVar5 = std::ostream::_M_insert<double>(dVar9);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      poVar5 = std::operator<<(&plVar4->super_ostream,"#Action = ");
      pNVar2 = (this->parser_->action_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(int)((ulong)((long)(pNVar2->super_Variable).values_.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              *(long *)&(pNVar2->super_Variable).values_.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data) >> 5));
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar4 = logging::stream(3);
      poVar5 = std::operator<<(&plVar4->super_ostream,"#Obs / log2(#Obs) = ");
      Parser::NumObservations(this->parser_);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5," / ");
      dVar9 = Parser::LogNumObservations(this->parser_);
      poVar5 = std::ostream::_M_insert<double>(dVar9);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  dVar9 = Parser::LogNumStates(this->parser_);
  this->is_small_ = dVar9 <= 15.0;
  if (dVar9 <= 15.0) {
    InitStates(this);
    InitTransitions(this);
    InitRewards(this);
    local_68 = INFINITY;
    lVar7 = 0;
    while( true ) {
      iVar3 = (*(this->super_MDP)._vptr_MDP[3])(this);
      if (iVar3 <= lVar7) break;
      lVar8 = 0;
      lVar6 = 0;
      dVar9 = local_68;
      while( true ) {
        iVar3 = (*(this->super_MDP)._vptr_MDP[2])(this);
        if (iVar3 <= lVar6) break;
        dVar10 = *(double *)
                  (*(long *)((long)&(((this->rewards_).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar8) + lVar7 * 8);
        if (dVar9 <= dVar10) {
          dVar10 = dVar9;
        }
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 0x18;
        dVar9 = dVar10;
      }
      pdVar1 = &(this->min_reward_action_).value;
      if (*pdVar1 <= dVar9 && dVar9 != *pdVar1) {
        ValuedAction::ValuedAction(&local_60,(ACT_TYPE)lVar7,dVar9);
        this_00->action = local_60.action;
        *(undefined4 *)&this_00->field_0x4 = local_60._4_4_;
        (this->min_reward_action_).value = local_60.value;
      }
      lVar7 = lVar7 + 1;
    }
  }
  return;
}

Assistant:

POMDPX::POMDPX(string params_file) {
	current_ = this;
	parser_ = new Parser(params_file);

	max_reward_action_ = parser_->ComputeMaxRewardAction();
	logi << "Max reward action = " << max_reward_action_ << " ";
	min_reward_action_ = parser_->ComputeMinRewardAction();
	logi << "Min reward action = " << min_reward_action_ << " ";
	logi << "#State / log2(#State) = " << parser_->NumStates() << " / "
		<< parser_->LogNumStates() << endl;
	logi << "#InitState / log2(#InitState) = " << parser_->NumInitialStates()
		<< " / " << parser_->LogNumInitialStates() << endl;
	logi << "#Action = " << parser_->NumActions() << endl;
	logi << "#Obs / log2(#Obs) = " << parser_->NumObservations() << " / "
		<< parser_->LogNumObservations() << endl;

	is_small_ = (parser_->LogNumStates() <= 15);

	if (is_small_) {
		InitStates();
		InitTransitions();
		InitRewards(); // Must be called after initializing transitions

		for (int a = 0; a < NumActions(); a++) {
			double min_reward = Globals::POS_INFTY;

			for (int s = 0; s < NumStates(); s++) {
				if (rewards_[s][a] < min_reward) {
					min_reward = rewards_[s][a];
				}
			}

			if (min_reward > min_reward_action_.value) {
				min_reward_action_ = ValuedAction(a, min_reward);
			}
		}
	}
}